

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

void ncnn::convolution_transform_kernel_packed_int8_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,int kernel_w,
               int kernel_h,int elempack,int out_elempack)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  uint _w;
  int j;
  ulong uVar4;
  int k;
  ulong uVar5;
  int i;
  ulong uVar6;
  Mat weight_data_r2;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,weight_data,_w,num_input,num_output,(Allocator *)0x0);
  Mat::create(weight_data_tm,_w,num_input / elempack,num_output / out_elempack,
              (ulong)(uint)out_elempack * (ulong)(uint)elempack,out_elempack * elempack,
              (Allocator *)0x0);
  if (out_elempack <= num_output) {
    uVar2 = 0;
    do {
      if (elempack <= num_input) {
        pvVar1 = (void *)((long)(int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 |
                                            uVar2 & 0xffffffff) / (long)out_elempack) *
                          weight_data_tm->cstep * weight_data_tm->elemsize +
                         (long)weight_data_tm->data);
        lVar3 = 0;
        do {
          if (0 < (int)_w) {
            uVar5 = 0;
            do {
              if (0 < out_elempack) {
                uVar6 = 0;
                do {
                  if (0 < elempack) {
                    uVar4 = 0;
                    do {
                      *(undefined1 *)((long)pvVar1 + uVar4) =
                           *(undefined1 *)
                            ((long)local_78.data +
                            uVar5 + (lVar3 + uVar4) * (long)local_78.w * local_78.elemsize +
                                    local_78.cstep * (uVar6 + uVar2) * local_78.elemsize);
                      uVar4 = uVar4 + 1;
                    } while ((uint)elempack != uVar4);
                    pvVar1 = (void *)((long)pvVar1 + uVar4);
                  }
                  uVar6 = uVar6 + 1;
                } while (uVar6 != (uint)out_elempack);
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 != _w);
          }
          lVar3 = lVar3 + elempack;
        } while (lVar3 < (long)num_input - (long)(elempack + -1));
      }
      uVar2 = uVar2 + (long)out_elempack;
    } while ((long)uVar2 < (long)num_output - (long)(out_elempack + -1));
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed_int8_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, int kernel_w, int kernel_h, int elempack, int out_elempack)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pa-pb-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < out_elempack; i++)
                    {
                        for (int j = 0; j < elempack; j++)
                        {
                            const signed char* k00 = weight_data_r2.channel(q + i).row<const signed char>(p + j);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }
}